

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.hh
# Opt level: O2

string * tinyusdz::removeSuffix(string *__return_storage_ptr__,string *str,string *suffix)

{
  bool bVar1;
  
  bVar1 = endsWith(str,suffix);
  if (bVar1) {
    ::std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)str);
  }
  else {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string removeSuffix(const std::string &str,
                                const std::string &suffix) {
  if (endsWith(str, suffix)) {
    return str.substr(0, str.length() - suffix.length());
  }
  return str;
}